

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O1

void __thiscall
vkt::image::anon_unknown_0::ImageSizeTestInstance::commandBeforeCompute
          (ImageSizeTestInstance *this,VkCommandBuffer cmdBuffer)

{
  VkImageSubresourceRange subresourceRange;
  DeviceInterface *pDVar1;
  VkImageMemoryBarrier barrierSetImageLayout;
  
  pDVar1 = Context::getDeviceInterface((this->super_SizeTestInstance).super_TestInstance.m_context);
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = (this->super_SizeTestInstance).m_texture.m_numLayers;
  makeImageMemoryBarrier
            (&barrierSetImageLayout,0,0,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,
             (VkImage)(((this->m_image).
                        super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.
                        m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal,subresourceRange);
  (*pDVar1->_vptr_DeviceInterface[0x6d])
            (pDVar1,cmdBuffer,1,0x800,0,0,0,0,0,1,(int)&barrierSetImageLayout);
  return;
}

Assistant:

void ImageSizeTestInstance::commandBeforeCompute (const VkCommandBuffer cmdBuffer)
{
	const DeviceInterface& vk = m_context.getDeviceInterface();

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, m_texture.numLayers());
	const VkImageMemoryBarrier barrierSetImageLayout = makeImageMemoryBarrier(
		0u, 0u,
		VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL,
		m_image->get(), subresourceRange);

	vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &barrierSetImageLayout);
}